

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringBuffer.cc
# Opt level: O3

void __thiscall Vector::storeValue(Vector *this,long v,unsigned_long l)

{
  ulong uVar1;
  long *__ptr;
  long lVar2;
  
  __ptr = this->vData;
  uVar1 = this->vaLength;
  if (uVar1 <= l) {
    lVar2 = (l + 1) - uVar1;
    if (lVar2 < vDefaultBoost) {
      lVar2 = vDefaultBoost;
    }
    this->vaLength = lVar2 + uVar1;
    __ptr = (long *)realloc(__ptr,(lVar2 + uVar1) * 8);
    this->vData = __ptr;
    this->vLength = l + 1;
  }
  __ptr[l] = v;
  return;
}

Assistant:

void Vector::storeValue(const long v, const unsigned long l) {
  long addThis;
  if (l >= vaLength) {
    addThis = l - vaLength + 1;
    if (Vector::vDefaultBoost > addThis)
      addThis = Vector::vDefaultBoost;
    vaLength += addThis;
    vData = (long *)realloc(vData, sizeof(long) * vaLength);
    vLength = l + 1;
  }
  vData[l] = v;
}